

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvalContext.cpp
# Opt level: O2

ConstantValue * __thiscall slang::ast::EvalContext::findLocal(EvalContext *this,ValueSymbol *symbol)

{
  size_type sVar1;
  pointer pFVar2;
  iterator iVar3;
  _Base_ptr *pp_Var4;
  ValueSymbol *local_18;
  
  sVar1 = (this->stack).super_SmallVectorBase<slang::ast::EvalContext::Frame>.len;
  if (sVar1 == 0) {
    pp_Var4 = (_Base_ptr *)0x0;
  }
  else {
    pFVar2 = (this->stack).super_SmallVectorBase<slang::ast::EvalContext::Frame>.data_;
    local_18 = symbol;
    iVar3 = std::
            _Rb_tree<const_slang::ast::ValueSymbol_*,_std::pair<const_slang::ast::ValueSymbol_*const,_slang::ConstantValue>,_std::_Select1st<std::pair<const_slang::ast::ValueSymbol_*const,_slang::ConstantValue>_>,_std::less<const_slang::ast::ValueSymbol_*>,_std::allocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::ConstantValue>_>_>
            ::find((_Rb_tree<const_slang::ast::ValueSymbol_*,_std::pair<const_slang::ast::ValueSymbol_*const,_slang::ConstantValue>,_std::_Select1st<std::pair<const_slang::ast::ValueSymbol_*const,_slang::ConstantValue>_>,_std::less<const_slang::ast::ValueSymbol_*>,_std::allocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::ConstantValue>_>_>
                    *)(pFVar2 + (sVar1 - 1)),&local_18);
    pp_Var4 = (_Base_ptr *)0x0;
    if ((_Rb_tree_header *)iVar3._M_node !=
        &pFVar2[sVar1 - 1].temporaries._M_t._M_impl.super__Rb_tree_header) {
      pp_Var4 = &iVar3._M_node[1]._M_parent;
    }
  }
  return (ConstantValue *)pp_Var4;
}

Assistant:

ConstantValue* EvalContext::findLocal(const ValueSymbol* symbol) {
    if (stack.empty())
        return nullptr;

    auto& frame = stack.back();
    auto it = frame.temporaries.find(symbol);
    if (it == frame.temporaries.end())
        return nullptr;
    return &it->second;
}